

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cc
# Opt level: O0

bool __thiscall tchecker::zg::zone_t::is_am_le(zone_t *this,zone_t *zone,map_t *m)

{
  clock_id_t dim;
  bool bVar1;
  db_t *dbm1;
  db_t *dbm2;
  int *m_00;
  map_t *m_local;
  zone_t *zone_local;
  zone_t *this_local;
  
  bVar1 = is_empty(this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = is_empty(zone);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      dbm1 = dbm_ptr(this);
      dbm2 = dbm_ptr(zone);
      dim = this->_dim;
      m_00 = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::ptr(m);
      this_local._7_1_ = tchecker::dbm::is_am_le(dbm1,dbm2,dim,m_00);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool zone_t::is_am_le(tchecker::zg::zone_t const & zone, tchecker::clockbounds::map_t const & m) const
{
  if (this->is_empty())
    return true;
  if (zone.is_empty())
    return false;
  return tchecker::dbm::is_am_le(dbm_ptr(), zone.dbm_ptr(), _dim, m.ptr());
}